

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_48(QPDF *pdf,char *arg2)

{
  bool bVar1;
  char cVar2;
  string *psVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  pointer pbVar9;
  undefined1 in_R8B;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle QVar17;
  QPDFObjectHandle QVar18;
  QPDFObjectHandle QVar19;
  QPDFObjectHandle QVar20;
  QPDFObjectHandle QVar21;
  QPDFObjectHandle QVar22;
  QPDFObjectHandle QVar23;
  QPDFObjectHandle QVar24;
  QPDFObjectHandle QVar25;
  allocator<char> local_581;
  iterator __begin1_1;
  QPDFNameTreeObjectHelper bad5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530 [8];
  iterator iter2;
  iterator iter1;
  iterator last;
  QPDFObjectHandle oh;
  allocator<char> local_400 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8 [3];
  QPDFNameTreeObjectHelper bad6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8 [6];
  QPDFNameTreeObjectHelper bad2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  string local_358 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  string local_348 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  string local_338 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  QPDFNameTreeObjectHelper bad4;
  string local_2f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e8;
  QPDFNameTreeObjectHelper bad3;
  string local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  string local_298 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  string local_288 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  string local_278 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  string local_268 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  string local_258 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  QPDFObjectHandle qtest;
  QPDFNameTreeObjectHelper bad1;
  QPDFNameTreeObjectHelper new1;
  QPDFNameTreeObjectHelper ntoh;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empties;
  string local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  string local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  string local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  string local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_138;
  QPDFNameTreeObjectHelper new2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ntoh_map;
  iterator local_c0;
  iterator local_78;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last,"/QTest",(allocator<char> *)&iter2);
  QPDFObjectHandle::getKey((string *)&qtest);
  std::__cxx11::string::~string((string *)&last);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter1.impl);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_138,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qtest);
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_138;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&ntoh,QVar10,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=(&last,&iter1);
    if (!bVar1) break;
    psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar4 = std::operator<<((ostream *)&std::cout,psVar3);
    poVar4 = std::operator<<(poVar4," -> ");
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)&iter2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&iter2);
    QPDFNameTreeObjectHelper::iterator::operator++(&last);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&iter1);
  QPDFNameTreeObjectHelper::iterator::~iterator(&last);
  QPDFNameTreeObjectHelper::getAsMap_abi_cxx11_();
  for (p_Var5 = ntoh_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &ntoh_map._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)(p_Var5 + 1));
    poVar4 = std::operator<<(poVar4," -> ");
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)&last);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&last);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last,"11 elephant",(allocator<char> *)&iter1);
  cVar2 = QPDFNameTreeObjectHelper::hasName((string *)&ntoh);
  if (cVar2 == '\0') {
    __assert_fail("ntoh.hasName(\"11 elephant\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x727,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&last);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last,anon_var_dwarf_199e7,(allocator<char> *)&iter1);
  cVar2 = QPDFNameTreeObjectHelper::hasName((string *)&ntoh);
  if (cVar2 == '\0') {
    __assert_fail("ntoh.hasName(\"07 sev\\xe2\\x80\\xa2n\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x728,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&last);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last,"potato",(allocator<char> *)&iter1);
  cVar2 = QPDFNameTreeObjectHelper::hasName((string *)&ntoh);
  if (cVar2 != '\0') {
    __assert_fail("!ntoh.hasName(\"potato\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x729,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&last);
  oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last,"potato",(allocator<char> *)&iter1);
  cVar2 = QPDFNameTreeObjectHelper::findObject((string *)&ntoh,(QPDFObjectHandle *)&last);
  if (cVar2 != '\0') {
    __assert_fail("!ntoh.findObject(\"potato\", oh)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72b,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&last);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&last,anon_var_dwarf_199e7,(allocator<char> *)&iter1);
  cVar2 = QPDFNameTreeObjectHelper::findObject((string *)&ntoh,(QPDFObjectHandle *)&last);
  if (cVar2 == '\0') {
    __assert_fail("ntoh.findObject(\"07 sev\\xe2\\x80\\xa2n\", oh)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72c,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&last);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  bVar1 = std::operator==("seven!",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&last);
  if (!bVar1) {
    __assert_fail("\"seven!\" == oh.getStringValue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72d,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&last);
  QPDFNameTreeObjectHelper::last();
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar6,"29 twenty-nine");
  if (!bVar1) {
    __assert_fail("last->first == \"29 twenty-nine\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72f,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &iter1,"twenty-nine!");
  if (!bVar1) {
    __assert_fail("last->second.getUTF8Value() == \"twenty-nine!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x730,"void test_48(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&iter1);
  QPDFNameTreeObjectHelper::newEmpty((QPDF *)&new1,SUB81(pdf,0));
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,&iter2);
  if (cVar2 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x734,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
  QPDFNameTreeObjectHelper::iterator::operator++(&iter1);
  QPDFNameTreeObjectHelper::end();
  cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,&iter2);
  if (cVar2 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x736,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
  QPDFNameTreeObjectHelper::iterator::operator--(&iter1);
  QPDFNameTreeObjectHelper::end();
  cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,&iter2);
  if (cVar2 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x738,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&iter2,"1",(allocator<char> *)&bad5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin1_1,"1",(allocator<char> *)&new2);
  QPDFObjectHandle::newString(local_258);
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter2;
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&new1;
  QPDFNameTreeObjectHelper::insert((string *)&local_78,QVar11);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
  std::__cxx11::string::~string((string *)&__begin1_1);
  std::__cxx11::string::~string((string *)&iter2);
  QPDFNameTreeObjectHelper::iterator::operator++(&iter1);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar6,"1");
  if (!bVar1) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x73b,"void test_48(QPDF &, const char *)");
  }
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
  QPDFNameTreeObjectHelper::iterator::operator--(&iter1);
  QPDFNameTreeObjectHelper::end();
  cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,&iter2);
  if (cVar2 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x73e,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
  QPDFNameTreeObjectHelper::iterator::operator--(&iter1);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar1 = std::operator==(pbVar7,"1");
  if (!bVar1) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x740,"void test_48(QPDF &, const char *)");
  }
  bVar1 = std::operator==(pbVar6,"1");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter2,"2",(allocator<char> *)&bad5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1_1,"2",(allocator<char> *)&new2);
    QPDFObjectHandle::newString(local_268);
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter2;
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&new1;
    QPDFNameTreeObjectHelper::insert((string *)&local_c0,QVar12);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260);
    std::__cxx11::string::~string((string *)&__begin1_1);
    std::__cxx11::string::~string((string *)&iter2);
    QPDFNameTreeObjectHelper::iterator::operator++(&iter1);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar7,"2");
    if (!bVar1) {
      __assert_fail("iter1->first == \"2\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x744,"void test_48(QPDF &, const char *)");
    }
    bVar1 = std::operator==(pbVar6,"2");
    if (!bVar1) {
      __assert_fail("iter1_val.first == \"2\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x745,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator++(&iter1);
    QPDFNameTreeObjectHelper::end();
    cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,&iter2);
    if (cVar2 == '\0') {
      __assert_fail("iter1 == new1.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x747,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
    if (pbVar6[1]._M_dataplus._M_p != (pointer)0x0) {
      __assert_fail("!iter1_val.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x748,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator++(&iter1);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar6,"1");
    if (!bVar1) {
      __assert_fail("iter1->first == \"1\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x74a,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator--(&iter1);
    QPDFNameTreeObjectHelper::end();
    cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,&iter2);
    if (cVar2 == '\0') {
      __assert_fail("iter1 == new1.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x74c,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
    QPDFNameTreeObjectHelper::iterator::operator--(&iter1);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar6,"2");
    if (!bVar1) {
      __assert_fail("iter1->first == \"2\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x74e,"void test_48(QPDF &, const char *)");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"insertAfter");
    std::endl<char,std::char_traits<char>>(poVar4);
    QPDFNameTreeObjectHelper::newEmpty((QPDF *)&new2,SUB81(pdf,0));
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&iter2,&__begin1_1);
    if (cVar2 == '\0') {
      __assert_fail("iter2 == new2.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x753,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1_1,"3",(allocator<char> *)&bad1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bad5,"3!",(allocator<char> *)&bad2);
    QPDFObjectHandle::newString(local_278);
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278;
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&__begin1_1;
    QPDFNameTreeObjectHelper::iterator::insertAfter((string *)&iter2,QVar13);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270);
    std::__cxx11::string::~string((string *)&bad5);
    std::__cxx11::string::~string((string *)&__begin1_1);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar6,"3");
    if (!bVar1) {
      __assert_fail("iter2->first == \"3\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x755,"void test_48(QPDF &, const char *)");
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1_1,"4",(allocator<char> *)&bad1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bad5,"4!",(allocator<char> *)&bad2);
    QPDFObjectHandle::newString(local_288);
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288;
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&__begin1_1;
    QPDFNameTreeObjectHelper::iterator::insertAfter((string *)&iter2,QVar14);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280);
    std::__cxx11::string::~string((string *)&bad5);
    std::__cxx11::string::~string((string *)&__begin1_1);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    bVar1 = std::operator==(pbVar6,"4");
    if (!bVar1) {
      __assert_fail("iter2->first == \"4\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x757,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    while( true ) {
      bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=(&__begin1_1,(iterator *)&bad5);
      if (!bVar1) break;
      psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
      poVar4 = std::operator<<((ostream *)&std::cout,psVar3);
      poVar4 = std::operator<<(poVar4," ");
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)&bad1);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&bad1);
      QPDFNameTreeObjectHelper::iterator::operator++(&__begin1_1);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
    QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1_1,"/Empty1",(allocator<char> *)&bad5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1_1.ivalue.first._M_string_length,"/Empty2",
               (allocator<char> *)&bad1);
    __l._M_len = 2;
    __l._M_array = (iterator)&__begin1_1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&empties,__l,(allocator_type *)&bad2);
    lVar8 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&__begin1_1._vptr_iterator + lVar8));
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x20);
    pbVar9 = empties.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar9 == empties.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        poVar4 = std::operator<<((ostream *)&std::cout,"/Bad1 -- wrong key type");
        std::endl<char,std::char_traits<char>>(poVar4);
        QPDF::getTrailer();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin1_1,"/Bad1",(allocator<char> *)&bad2);
        QPDFObjectHandle::getKey(local_298);
        QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
        QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_298;
        QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad1,QVar19,(QPDF *)0x1,(bool)in_R8B);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
        std::__cxx11::string::~string((string *)&__begin1_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bad5,"G",(allocator<char> *)&bad2);
        QPDFNameTreeObjectHelper::find((string *)&__begin1_1,SUB81(&bad1,0));
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        bVar1 = std::operator==(pbVar6,"A");
        if (!bVar1) {
          __assert_fail("bad1.find(\"G\", true)->first == \"A\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x776,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        std::__cxx11::string::~string((string *)&bad5);
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::end();
        while( true ) {
          bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=(&__begin1_1,(iterator *)&bad5);
          if (!bVar1) break;
          psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
          poVar4 = std::operator<<((ostream *)&std::cout,psVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
          QPDFNameTreeObjectHelper::iterator::operator++(&__begin1_1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        poVar4 = std::operator<<((ostream *)&std::cout,"/Bad2 -- invalid kid");
        std::endl<char,std::char_traits<char>>(poVar4);
        QPDF::getTrailer();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin1_1,"/Bad2",(allocator<char> *)&bad3);
        QPDFObjectHandle::getKey(local_2a8);
        QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
        QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_2a8;
        QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad2,QVar20,(QPDF *)0x1,(bool)in_R8B);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0);
        std::__cxx11::string::~string((string *)&__begin1_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bad5,"G",(allocator<char> *)&bad3);
        QPDFNameTreeObjectHelper::find((string *)&__begin1_1,SUB81(&bad2,0));
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        bVar1 = std::operator==(pbVar6,"B");
        if (!bVar1) {
          __assert_fail("bad2.find(\"G\", true)->first == \"B\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x77d,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        std::__cxx11::string::~string((string *)&bad5);
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::end();
        while( true ) {
          bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=(&__begin1_1,(iterator *)&bad5);
          if (!bVar1) break;
          psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
          poVar4 = std::operator<<((ostream *)&std::cout,psVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
          QPDFNameTreeObjectHelper::iterator::operator++(&__begin1_1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        poVar4 = std::operator<<((ostream *)&std::cout,"/Bad3 -- invalid kid");
        std::endl<char,std::char_traits<char>>(poVar4);
        QPDF::getTrailer();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin1_1,"/Bad3",(allocator<char> *)&bad4);
        QPDFObjectHandle::getKey(local_2f0);
        QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
        QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_2f0;
        QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad3,QVar21,(QPDF *)0x1,(bool)in_R8B);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8);
        std::__cxx11::string::~string((string *)&__begin1_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bad4,"G",(allocator<char> *)&bad6);
        QPDFNameTreeObjectHelper::find((string *)&__begin1_1,SUB81(&bad3,0));
        QPDFNameTreeObjectHelper::end();
        cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&__begin1_1,(iterator *)&bad5);
        if (cVar2 == '\0') {
          __assert_fail("bad3.find(\"G\", true) == bad3.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x784,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        std::__cxx11::string::~string((string *)&bad4);
        poVar4 = std::operator<<((ostream *)&std::cout,"/Bad4 -- invalid kid");
        std::endl<char,std::char_traits<char>>(poVar4);
        QPDF::getTrailer();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin1_1,"/Bad4",(allocator<char> *)&bad6);
        QPDFObjectHandle::getKey(local_338);
        QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
        QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_338;
        QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad4,QVar22,(QPDF *)0x1,(bool)in_R8B);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330);
        std::__cxx11::string::~string((string *)&__begin1_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bad5,"F",(allocator<char> *)&bad6);
        QPDFNameTreeObjectHelper::find((string *)&__begin1_1,SUB81(&bad4,0));
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        bVar1 = std::operator==(pbVar6,"C");
        if (!bVar1) {
          __assert_fail("bad4.find(\"F\", true)->first == \"C\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x788,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        std::__cxx11::string::~string((string *)&bad5);
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::end();
        while( true ) {
          bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=(&__begin1_1,(iterator *)&bad5);
          if (!bVar1) break;
          psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
          poVar4 = std::operator<<((ostream *)&std::cout,psVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
          QPDFNameTreeObjectHelper::iterator::operator++(&__begin1_1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
        QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
        poVar4 = std::operator<<((ostream *)&std::cout,"/Bad5 -- loop in find");
        std::endl<char,std::char_traits<char>>(poVar4);
        QPDF::getTrailer();
        std::__cxx11::string::string<std::allocator<char>>((string *)&__begin1_1,"/Bad5",local_400);
        QPDFObjectHandle::getKey(local_348);
        QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
        QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_348;
        QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad5,QVar23,(QPDF *)0x1,(bool)in_R8B);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_340);
        std::__cxx11::string::~string((string *)&__begin1_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3d8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&bad6,"F",local_400);
        QPDFNameTreeObjectHelper::find((string *)&__begin1_1,SUB81(&bad5,0));
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        bVar1 = std::operator==(pbVar6,"D");
        if (bVar1) {
          QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
          std::__cxx11::string::~string((string *)&bad6);
          poVar4 = std::operator<<((ostream *)&std::cout,"/Bad6 -- bad limits");
          std::endl<char,std::char_traits<char>>(poVar4);
          QPDF::getTrailer();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__begin1_1,"/Bad6",&local_581);
          QPDFObjectHandle::getKey(local_358);
          QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
          QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_358;
          QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad6,QVar24,(QPDF *)0x1,(bool)in_R8B);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
          std::__cxx11::string::~string((string *)&__begin1_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3f8);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_400,"H",&local_581);
          QPDFObjectHandle::newNull();
          QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400;
          QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&bad6;
          QPDFNameTreeObjectHelper::insert((string *)&__begin1_1,QVar25);
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
          bVar1 = std::operator==(pbVar6,"H");
          if (bVar1) {
            QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360);
            std::__cxx11::string::~string((string *)local_400);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad6);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad5);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad4);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad3);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad2);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&empties);
            QPDFNameTreeObjectHelper::iterator::~iterator(&iter2);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&new2);
            QPDFNameTreeObjectHelper::iterator::~iterator(&iter1);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&new1);
            QPDFNameTreeObjectHelper::iterator::~iterator(&last);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&oh.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            ::~_Rb_tree(&ntoh_map._M_t);
            QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&ntoh);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&qtest.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            return;
          }
          __assert_fail("bad6.insert(\"H\", QPDFObjectHandle::newNull())->first == \"H\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x793,"void test_48(QPDF &, const char *)");
        }
        __assert_fail("bad5.find(\"F\", true)->first == \"D\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x78f,"void test_48(QPDF &, const char *)");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar9);
      std::endl<char,std::char_traits<char>>(poVar4);
      QPDF::getTrailer();
      QPDFObjectHandle::getKey(local_148);
      QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
      QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_148;
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&bad1,QVar15,(QPDF *)0x1,(bool)in_R8B);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin1_1.impl);
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::end();
      cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&__begin1_1,(iterator *)&bad5);
      if (cVar2 == '\0') {
        __assert_fail("empty.begin() == empty.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x760,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
      QPDFNameTreeObjectHelper::last();
      QPDFNameTreeObjectHelper::end();
      cVar2 = QPDFNameTreeObjectHelper::iterator::operator==(&__begin1_1,(iterator *)&bad5);
      if (cVar2 == '\0') {
        __assert_fail("empty.last() == empty.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x761,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bad5,"five",(allocator<char> *)&bad3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bad2,"5",(allocator<char> *)&bad4);
      QPDFObjectHandle::newString(local_158);
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bad5;
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)&bad1;
      QPDFNameTreeObjectHelper::insert((string *)&__begin1_1,QVar16);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
      std::__cxx11::string::~string((string *)&bad2);
      std::__cxx11::string::~string((string *)&bad5);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar6,"five");
      if (!bVar1) {
        __assert_fail("i->first == \"five\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x763,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad5,"5");
      if (!bVar1) {
        __assert_fail("i->second.getStringValue() == \"5\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x764,"void test_48(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bad5);
      QPDFNameTreeObjectHelper::begin();
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar6,"five");
      if (!bVar1) {
        __assert_fail("empty.begin()->first == \"five\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x765,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::last();
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar6,"five");
      if (!bVar1) {
        __assert_fail("empty.last()->first == \"five\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x766,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad2,"5");
      if (!bVar1) {
        __assert_fail("empty.begin()->second.getStringValue() == \"5\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x767,"void test_48(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bad2);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bad2,"five",(allocator<char> *)&bad4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bad3,"5+",(allocator<char> *)&bad6);
      QPDFObjectHandle::newString(local_168);
      QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bad2;
      QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)&bad1;
      QPDFNameTreeObjectHelper::insert((string *)&bad5,QVar17);
      QPDFNameTreeObjectHelper::iterator::operator=(&__begin1_1,(iterator *)&bad5);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
      std::__cxx11::string::~string((string *)&bad3);
      std::__cxx11::string::~string((string *)&bad2);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar6,"five");
      if (!bVar1) {
        __assert_fail("i->first == \"five\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x769,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad5,"5+");
      if (!bVar1) {
        __assert_fail("i->second.getStringValue() == \"5+\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x76a,"void test_48(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bad5);
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad2,"5+");
      if (!bVar1) {
        __assert_fail("empty.begin()->second.getStringValue() == \"5+\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x76b,"void test_48(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bad2);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bad2,"six",(allocator<char> *)&bad4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bad3,"6",(allocator<char> *)&bad6);
      QPDFObjectHandle::newString(local_178);
      QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&bad2;
      QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)&bad1;
      QPDFNameTreeObjectHelper::insert((string *)&bad5,QVar18);
      QPDFNameTreeObjectHelper::iterator::operator=(&__begin1_1,(iterator *)&bad5);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170);
      std::__cxx11::string::~string((string *)&bad3);
      std::__cxx11::string::~string((string *)&bad2);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar6,"six");
      if (!bVar1) {
        __assert_fail("i->first == \"six\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x76d,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad5,"6");
      if (!bVar1) break;
      std::__cxx11::string::~string((string *)&bad5);
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad2,"5+");
      if (!bVar1) {
        __assert_fail("empty.begin()->second.getStringValue() == \"5+\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x76f,"void test_48(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bad2);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::last();
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      bVar1 = std::operator==(pbVar6,"six");
      if (!bVar1) {
        __assert_fail("empty.last()->first == \"six\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x770,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::last();
      QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bad2,"6");
      if (!bVar1) {
        __assert_fail("empty.last()->second.getStringValue() == \"6\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x771,"void test_48(QPDF &, const char *)");
      }
      std::__cxx11::string::~string((string *)&bad2);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&bad5);
      QPDFNameTreeObjectHelper::iterator::~iterator(&__begin1_1);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&bad1);
      pbVar9 = pbVar9 + 1;
    }
    __assert_fail("i->second.getStringValue() == \"6\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x76e,"void test_48(QPDF &, const char *)");
  }
  __assert_fail("iter1_val.first == \"1\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x741,"void test_48(QPDF &, const char *)");
}

Assistant:

static void
test_48(QPDF& pdf, char const* arg2)
{
    // Test name tree. This test is crafted to work with
    // name-tree.pdf
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFNameTreeObjectHelper ntoh(qtest, pdf);
    for (auto& iter: ntoh) {
        std::cout << iter.first << " -> " << iter.second.getStringValue() << std::endl;
    }
    std::map<std::string, QPDFObjectHandle> ntoh_map = ntoh.getAsMap();
    for (auto& iter: ntoh_map) {
        std::cout << iter.first << " -> " << iter.second.getStringValue() << std::endl;
    }
    assert(ntoh.hasName("11 elephant"));
    assert(ntoh.hasName("07 sev\xe2\x80\xa2n"));
    assert(!ntoh.hasName("potato"));
    QPDFObjectHandle oh;
    assert(!ntoh.findObject("potato", oh));
    assert(ntoh.findObject("07 sev\xe2\x80\xa2n", oh));
    assert("seven!" == oh.getStringValue());
    auto last = ntoh.last();
    assert(last->first == "29 twenty-nine");
    assert(last->second.getUTF8Value() == "twenty-nine!");

    auto new1 = QPDFNameTreeObjectHelper::newEmpty(pdf);
    auto iter1 = new1.begin();
    assert(iter1 == new1.end());
    ++iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1 == new1.end());
    new1.insert("1", QPDFObjectHandle::newString("1"));
    ++iter1;
    assert(iter1->first == "1");
    auto& iter1_val = *iter1;
    --iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1->first == "1");
    assert(iter1_val.first == "1");
    new1.insert("2", QPDFObjectHandle::newString("2"));
    ++iter1;
    assert(iter1->first == "2");
    assert(iter1_val.first == "2");
    ++iter1;
    assert(iter1 == new1.end());
    assert(!iter1_val.second);
    ++iter1;
    assert(iter1->first == "1");
    --iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1->first == "2");

    std::cout << "insertAfter" << std::endl;
    auto new2 = QPDFNameTreeObjectHelper::newEmpty(pdf);
    auto iter2 = new2.begin();
    assert(iter2 == new2.end());
    iter2.insertAfter("3", QPDFObjectHandle::newString("3!"));
    assert(iter2->first == "3");
    iter2.insertAfter("4", QPDFObjectHandle::newString("4!"));
    assert(iter2->first == "4");
    for (auto& i: new2) {
        std::cout << i.first << " " << i.second.unparse() << std::endl;
    }

    std::vector<std::string> empties = {"/Empty1", "/Empty2"};
    for (auto const& k: empties) {
        std::cout << k << std::endl;
        auto empty = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey(k), pdf);
        assert(empty.begin() == empty.end());
        assert(empty.last() == empty.end());
        auto i = empty.insert("five", QPDFObjectHandle::newString("5"));
        assert(i->first == "five");
        assert(i->second.getStringValue() == "5");
        assert(empty.begin()->first == "five");
        assert(empty.last()->first == "five");
        assert(empty.begin()->second.getStringValue() == "5");
        i = empty.insert("five", QPDFObjectHandle::newString("5+"));
        assert(i->first == "five");
        assert(i->second.getStringValue() == "5+");
        assert(empty.begin()->second.getStringValue() == "5+");
        i = empty.insert("six", QPDFObjectHandle::newString("6"));
        assert(i->first == "six");
        assert(i->second.getStringValue() == "6");
        assert(empty.begin()->second.getStringValue() == "5+");
        assert(empty.last()->first == "six");
        assert(empty.last()->second.getStringValue() == "6");
    }

    std::cout << "/Bad1 -- wrong key type" << std::endl;
    auto bad1 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad1"), pdf);
    assert(bad1.find("G", true)->first == "A");
    for (auto const& i: bad1) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad2 -- invalid kid" << std::endl;
    auto bad2 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad2"), pdf);
    assert(bad2.find("G", true)->first == "B");
    for (auto const& i: bad2) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad3 -- invalid kid" << std::endl;
    auto bad3 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad3"), pdf);
    assert(bad3.find("G", true) == bad3.end());

    std::cout << "/Bad4 -- invalid kid" << std::endl;
    auto bad4 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad4"), pdf);
    assert(bad4.find("F", true)->first == "C");
    for (auto const& i: bad4) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad5 -- loop in find" << std::endl;
    auto bad5 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad5"), pdf);
    assert(bad5.find("F", true)->first == "D");

    std::cout << "/Bad6 -- bad limits" << std::endl;
    auto bad6 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad6"), pdf);
    assert(bad6.insert("H", QPDFObjectHandle::newNull())->first == "H");
}